

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O1

void __thiscall AstWalker::visitStatementAstNode(AstWalker *this,StatementAstNode *node)

{
  long lVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  string local_38;
  
  if (node == (StatementAstNode *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&DeclareStatementAstNode::typeinfo,0);
  }
  if (lVar1 == 0) {
    if (node == (StatementAstNode *)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&AssignStatementAstNode::typeinfo,0);
    }
    if (lVar1 == 0) {
      if (node == (StatementAstNode *)0x0) {
        lVar1 = 0;
      }
      else {
        lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&IfStatementAstNode::typeinfo,0);
      }
      if (lVar1 == 0) {
        if (node == (StatementAstNode *)0x0) {
          lVar1 = 0;
        }
        else {
          lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&WhileStatementAstNode::typeinfo,0
                                );
        }
        if (lVar1 == 0) {
          if (node == (StatementAstNode *)0x0) {
            lVar1 = 0;
          }
          else {
            lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,&BreakStatementAstNode::typeinfo
                                   ,0);
          }
          if (lVar1 == 0) {
            if (node == (StatementAstNode *)0x0) {
              lVar1 = 0;
            }
            else {
              lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                     &ReturnStatementAstNode::typeinfo,0);
            }
            if (lVar1 == 0) {
              if (node == (StatementAstNode *)0x0) {
                lVar1 = 0;
              }
              else {
                lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                       &BlockStatementAstNode::typeinfo,0);
              }
              if (lVar1 == 0) {
                if (node == (StatementAstNode *)0x0) {
                  lVar1 = 0;
                }
                else {
                  lVar1 = __dynamic_cast(node,&StatementAstNode::typeinfo,
                                         &ExpressionStatementAstNode::typeinfo,0);
                }
                if (lVar1 == 0) {
                  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_38,
                             "visitStatementAstNode called with unexpected node type","");
                  Error::assertWithPanic(false,&local_38);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_38._M_dataplus._M_p != &local_38.field_2) {
                    operator_delete(local_38._M_dataplus._M_p,
                                    local_38.field_2._M_allocated_capacity + 1);
                  }
                  return;
                }
                UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0x12];
              }
              else {
                UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[0xb];
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[10];
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[9];
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[8];
        }
      }
      else {
        UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[7];
      }
    }
    else {
      UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[6];
    }
  }
  else {
    UNRECOVERED_JUMPTABLE = this->_vptr_AstWalker[5];
  }
  (*UNRECOVERED_JUMPTABLE)(this,lVar1);
  return;
}

Assistant:

void AstWalker::visitStatementAstNode(StatementAstNode* node) noexcept {

  auto declare = dynamic_cast<DeclareStatementAstNode*>(node);
  if (declare != nullptr) {
    this->visitDeclareStatementAstNode(declare);
    return;
  }

  auto assign = dynamic_cast<AssignStatementAstNode*>(node);
  if (assign != nullptr) {
    this->visitAssignStatementAstNode(assign);
    return;
  }

  auto ifStmt = dynamic_cast<IfStatementAstNode*>(node);
  if (ifStmt != nullptr) {
    this->visitIfStatementAstNode(ifStmt);
    return;
  }

  auto whileStmt = dynamic_cast<WhileStatementAstNode*>(node);
  if (whileStmt != nullptr) {
    this->visitWhileStatementAstNode(whileStmt);
    return;
  }

  auto breakStmt = dynamic_cast<BreakStatementAstNode*>(node);
  if (breakStmt != nullptr) {
    this->visitBreakStatementAstNode(breakStmt);
    return;
  }

  auto returnStmt = dynamic_cast<ReturnStatementAstNode*>(node);
  if (returnStmt != nullptr) {
    this->visitReturnStatementAstNode(returnStmt);
    return;
  }

  auto block = dynamic_cast<BlockStatementAstNode*>(node);
  if (block != nullptr) {
    this->visitBlockStatementAstNode(block);
    return;
  }

  auto expr = dynamic_cast<ExpressionStatementAstNode*>(node);
  if (expr != nullptr) {
    this->visitExpressionStatementAstNode(expr);
    return;
  }

  Error::assertWithPanic(false, "visitStatementAstNode called with unexpected node type");
}